

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O2

HeapType __thiscall
wasm::anon_unknown_20::HeapTypeGeneratorImpl::pickSubFunc(HeapTypeGeneratorImpl *this)

{
  uint uVar1;
  pointer pvVar2;
  undefined1 auVar3 [8];
  pointer pHVar4;
  uint32_t uVar5;
  value_type *pvVar6;
  ulong uVar7;
  HeapTypeGeneratorImpl *pHStack_80;
  Entry local_70;
  HeapType local_60;
  undefined1 auStack_58 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> candidates;
  
  uVar5 = Random::upTo(this->rand,8);
  if (uVar5 == 0) {
    pHStack_80 = (HeapTypeGeneratorImpl *)0x1;
  }
  else if (uVar5 == 1) {
    pHStack_80 = (HeapTypeGeneratorImpl *)0xd;
  }
  else {
    candidates.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_58 = (undefined1  [8])0x0;
    candidates.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    uVar1 = (this->recGroupEnds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[this->index];
    for (uVar7 = 0;
        pHVar4 = candidates.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_start, auVar3 = auStack_58, uVar1 != uVar7;
        uVar7 = uVar7 + 1) {
      pvVar2 = (this->typeKinds).
               super__Vector_base<std::variant<wasm::HeapType::BasicHeapType,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::HeapType::BasicHeapType,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pvVar2 != (pointer)0x0) &&
         (*(__index_type *)
           ((long)&pvVar2[uVar7].
                   super__Variant_base<wasm::HeapType::BasicHeapType,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   .
                   super__Move_assign_alias<wasm::HeapType::BasicHeapType,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   .
                   super__Copy_assign_alias<wasm::HeapType::BasicHeapType,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
           + 4) == '\x01')) {
        local_70.builder = this->builder;
        local_70.index = uVar7;
        local_60 = TypeBuilder::Entry::operator_cast_to_HeapType(&local_70);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58,&local_60);
      }
    }
    if ((undefined1  [8])
        candidates.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start != auStack_58) {
      pvVar6 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                         (this->rand,
                          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58);
      this = (HeapTypeGeneratorImpl *)pvVar6->id;
    }
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58);
    pHStack_80 = this;
    if ((undefined1  [8])pHVar4 == auVar3) {
      pHStack_80 = (HeapTypeGeneratorImpl *)0x1;
      if ((uVar5 & 1) == 0) {
        pHStack_80 = (HeapTypeGeneratorImpl *)0xd;
      }
    }
  }
  return (HeapType)(uintptr_t)pHStack_80;
}

Assistant:

HeapType pickSubFunc() {
    auto choice = rand.upTo(8);
    switch (choice) {
      case 0:
        return HeapType::func;
      case 1:
        return HeapType::nofunc;
      default:
        if (auto type = pickKind<SignatureKind>()) {
          return *type;
        }
        return (choice % 2) ? HeapType::func : HeapType::nofunc;
    }
  }